

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O1

string * __thiscall
duckdb::BoxRenderer::GetRenderValue_abi_cxx11_
          (string *__return_storage_ptr__,BoxRenderer *this,BaseResultRenderer *ss,
          ColumnDataRowCollection *rows,idx_t c,idx_t r,LogicalType *type,
          ResultRenderType *render_mode)

{
  pointer pcVar1;
  string *input;
  Value row;
  Value local_90;
  
  *render_mode = VALUE;
  if (&ss->value_type != type) {
    (ss->value_type).id_ = type->id_;
    (ss->value_type).physical_type_ = type->physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(ss->value_type).type_info_,&type->type_info_);
  }
  ColumnDataRowCollection::GetValue(&local_90,rows,c,r);
  if (local_90.is_null == true) {
    *render_mode = NULL_VALUE;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->config).null_value._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->config).null_value._M_string_length);
  }
  else {
    input = StringValue::Get_abi_cxx11_(&local_90);
    ConvertRenderValue(__return_storage_ptr__,this,input,type);
  }
  Value::~Value(&local_90);
  return __return_storage_ptr__;
}

Assistant:

string BoxRenderer::GetRenderValue(BaseResultRenderer &ss, ColumnDataRowCollection &rows, idx_t c, idx_t r,
                                   const LogicalType &type, ResultRenderType &render_mode) {
	try {
		render_mode = ResultRenderType::VALUE;
		ss.SetValueType(type);
		auto row = rows.GetValue(c, r);
		if (row.IsNull()) {
			render_mode = ResultRenderType::NULL_VALUE;
			return config.null_value;
		}
		return ConvertRenderValue(StringValue::Get(row), type);
	} catch (std::exception &ex) {
		return "????INVALID VALUE - " + string(ex.what()) + "?????";
	}
}